

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::StringReplace
              (ScriptContext *scriptContext,JavascriptString *match,JavascriptString *input,
              RecyclableObject *replacefn)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  charcount_t cVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  char *pcVar8;
  undefined4 *puVar9;
  JavascriptMethod p_Var10;
  RecyclableObject *pRVar11;
  JavascriptString *pJVar12;
  char16 *prefix;
  char16 *content;
  charcount_t cchPrefix;
  ulong uVar13;
  BufferStringBuilder local_60;
  BufferStringBuilder bufferString;
  
  pcVar8 = JavascriptString::strstr((char *)input,(char *)match);
  if ((((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d1,"(match->GetScriptContext() == scriptContext)",
                                "match->GetScriptContext() == scriptContext");
    if (!bVar3) goto LAB_00d4f39a;
    *puVar9 = 0;
  }
  if ((((((input->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d2,"(input->GetScriptContext() == scriptContext)",
                                "input->GetScriptContext() == scriptContext");
    if (!bVar3) {
LAB_00d4f39a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  cchPrefix = (charcount_t)pcVar8;
  if (cchPrefix == 0xffffffff) {
    return input;
  }
  this = scriptContext->threadContext;
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(replacefn);
  bVar4 = ThreadContext::HasNoSideEffect(this,replacefn,attributes);
  uVar13 = (ulong)pcVar8 & 0xffffffff;
  if (bVar4) {
    pRVar11 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint(replacefn);
    CheckIsExecutable(replacefn,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(replacefn);
    pRVar11 = (RecyclableObject *)
              (*p_Var10)(replacefn,(CallInfo)replacefn,4,0,0,0,0,4,pRVar11,match,
                         uVar13 | 0x1000000000000,input);
    bVar4 = ThreadContext::IsOnStack(pRVar11);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar11 = (((((((((replacefn->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                    ).scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00d4f236;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      bufferString.m_string =
           (WritableString *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      if (this->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var10 = RecyclableObject::GetEntryPoint(replacefn);
      CheckIsExecutable(replacefn,p_Var10);
      p_Var10 = RecyclableObject::GetEntryPoint(replacefn);
      pRVar11 = (RecyclableObject *)
                (*p_Var10)(replacefn,(CallInfo)replacefn,4,0,0,0,0,4,bufferString.m_string,match,
                           uVar13 | 0x1000000000000,input);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00d4f236;
    }
    pRVar11 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint(replacefn);
    CheckIsExecutable(replacefn,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(replacefn);
    pRVar11 = (RecyclableObject *)
              (*p_Var10)(replacefn,(CallInfo)replacefn,4,0,0,0,0,4,pRVar11,match,
                         uVar13 | 0x1000000000000,input);
    bVar4 = ThreadContext::IsOnStack(pRVar11);
  }
  if (bVar4 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00d4f236:
  this->reentrancySafeOrHandled = bVar3;
  pJVar12 = JavascriptConversion::ToString(pRVar11,scriptContext);
  prefix = JavascriptString::GetString(input);
  cVar5 = JavascriptString::GetLength(match);
  cVar6 = JavascriptString::GetLength(input);
  cVar7 = JavascriptString::GetLength(match);
  cVar6 = cVar6 - (cVar7 + cchPrefix);
  cVar7 = JavascriptString::GetLength(pJVar12);
  local_60.m_string =
       BufferStringBuilder::WritableString::New
                 (cchPrefix + cVar6 + cVar7,
                  (((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                  super_JavascriptLibraryBase).scriptContext.ptr);
  content = JavascriptString::GetString(pJVar12);
  cVar7 = JavascriptString::GetLength(pJVar12);
  BufferStringBuilder::DbgAssertNotFrozen(&local_60);
  BufferStringBuilder::WritableString::SetContent
            (local_60.m_string,prefix,cchPrefix,content,cVar7,prefix + uVar13 + cVar5,cVar6);
  pJVar12 = BufferStringBuilder::ToString(&local_60);
  return pJVar12;
}

Assistant:

Var RegexHelper::StringReplace(ScriptContext* scriptContext, JavascriptString* match, JavascriptString* input, RecyclableObject* replacefn)
    {
        CharCount indexMatched = JavascriptString::strstr(input, match, true);
        Assert(match->GetScriptContext() == scriptContext);
        Assert(input->GetScriptContext() == scriptContext);

        if (indexMatched != CharCountFlag)
        {
            ThreadContext* threadContext = scriptContext->GetThreadContext();
            Var replaceVar = threadContext->ExecuteImplicitCall(replacefn, ImplicitCall_Accessor, [=]()->Js::Var
            {
                Var pThis = scriptContext->GetLibrary()->GetUndefined();
                return CALL_FUNCTION(threadContext, replacefn, CallInfo(4), pThis, match, JavascriptNumber::ToVar((int)indexMatched, scriptContext), input);
            });
            JavascriptString* replace = JavascriptConversion::ToString(replaceVar, scriptContext);
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = indexMatched;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                replace->GetString(), replace->GetLength(),
                postfixStr, postfixLength);
            return bufferString.ToString();
        }

        return input;
    }